

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::Catalog::CreateIndex(Catalog *this,CatalogTransaction transaction,CreateIndexInfo *info)

{
  optional_ptr<duckdb::SchemaCatalogEntry,_true> oVar1;
  int iVar2;
  undefined4 extraout_var;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  EntryLookupInfo schema_lookup;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> local_70;
  EntryLookupInfo local_68;
  optional_ptr<duckdb::CatalogEntry,_true> local_48;
  ClientContext *pCStack_40;
  Transaction *local_38;
  transaction_t tStack_30;
  transaction_t local_28;
  undefined4 extraout_var_00;
  
  local_28 = transaction.start_time;
  local_48.ptr = (CatalogEntry *)transaction.db.ptr;
  pCStack_40 = (ClientContext *)transaction.context.ptr;
  local_38 = (Transaction *)transaction.transaction.ptr;
  tStack_30 = transaction.transaction_id;
  EntryLookupInfo::EntryLookupInfo
            (&local_68,SCHEMA_ENTRY,&(info->super_CreateInfo).schema,
             (QueryErrorContext)0xffffffffffffffff);
  iVar2 = (*this->_vptr_Catalog[8])(this,&local_68,0);
  local_70.ptr = (SchemaCatalogEntry *)CONCAT44(extraout_var,iVar2);
  optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&local_70);
  oVar1.ptr = local_70.ptr;
  local_48 = SchemaCatalogEntry::GetEntry(local_70.ptr,transaction,TABLE_ENTRY,&info->table);
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_48);
  oVar3.ptr._0_4_ =
       (*((oVar1.ptr)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x12])
                 (oVar1.ptr,info,local_48.ptr);
  oVar3.ptr._4_4_ = extraout_var_00;
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar3.ptr;
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreateIndex(CatalogTransaction transaction, CreateIndexInfo &info) {
	auto &schema = GetSchema(transaction, info.schema);
	auto &table = schema.GetEntry(transaction, CatalogType::TABLE_ENTRY, info.table)->Cast<TableCatalogEntry>();
	return schema.CreateIndex(transaction, info, table);
}